

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumented_benchmark.cpp
# Opt level: O0

bool benchmarkMany(uint32_t n,uint32_t m,uint32_t iterations,pospopcnt_u16_method_type fn,
                  bool verbose,bool test)

{
  value_type vVar1;
  value_type vVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  code *pcVar5;
  result_type rVar6;
  size_type sVar7;
  reference pvVar8;
  reference pvVar9;
  unsigned_short *puVar10;
  uint *puVar11;
  reference pvVar12;
  reference pvVar13;
  reference pvVar14;
  reference pvVar15;
  code *in_RCX;
  uint in_EDX;
  uint in_ESI;
  int in_EDI;
  byte in_R8B;
  byte in_R9B;
  undefined1 auVar17 [16];
  double dVar16;
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  undefined1 auVar18 [16];
  undefined1 in_ZMM1 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar19 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar20 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar21 [16];
  vector<double,_std::allocator<double>_> avg;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> mins;
  size_t k_4;
  size_t km_1;
  size_t k_3;
  size_t km;
  uint64_t tot_obs;
  size_t k_2;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  flags;
  size_t k_1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  correctflags;
  size_t k2;
  size_t k;
  uint32_t i;
  bool isok;
  uniform_int_distribution<int> dis;
  mt19937 gen;
  random_device rd;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  allresults;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> results;
  LinuxEvents<0> unified;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  vdata;
  vector<int,_std::allocator<int>_> evts;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffd4b8;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *pvVar22;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffd4c0;
  allocator_type *in_stack_ffffffffffffd4c8;
  vector<double,_std::allocator<double>_> *this;
  allocator_type *in_stack_ffffffffffffd4d0;
  size_type in_stack_ffffffffffffd4d8;
  value_type vVar23;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_stack_ffffffffffffd4e0;
  value_type vVar24;
  random_device *in_stack_ffffffffffffd500;
  value_type vVar25;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffd508;
  value_type vVar26;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffd510;
  value_type vVar27;
  LinuxEvents<0> *in_stack_ffffffffffffd530;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  *in_stack_ffffffffffffd538;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *in_stack_ffffffffffffd548;
  undefined4 in_stack_ffffffffffffd550;
  value_type in_stack_ffffffffffffd554;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffd558;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  *this_00;
  LinuxEvents<0> *in_stack_ffffffffffffd560;
  vector<double,_std::allocator<double>_> local_29c8 [2];
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> local_2998;
  ulong local_2980;
  ulong local_2978;
  int local_296c;
  ulong local_2968;
  ulong local_2960;
  long local_2958;
  ulong local_2950;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_2928;
  ulong local_2910;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_28e8;
  ulong local_28d0;
  ulong local_28c8;
  uint local_28c0;
  byte local_28b9;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  local_50;
  vector<int,_std::allocator<int>_> local_38;
  byte local_1a;
  byte local_19;
  code *local_18;
  uint local_10;
  uint local_c;
  int local_8;
  byte local_1;
  
  local_19 = in_R8B & 1;
  local_1a = in_R9B & 1;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_EDI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x15c1dd);
  std::allocator<unsigned_short>::allocator((allocator<unsigned_short> *)0x15c210);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_ffffffffffffd4e0,
             in_stack_ffffffffffffd4d8,in_stack_ffffffffffffd4d0);
  std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>::allocator
            ((allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_> *)0x15c244);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::vector((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
            *)in_stack_ffffffffffffd4e0,in_stack_ffffffffffffd4d8,
           (value_type *)in_stack_ffffffffffffd4d0,in_stack_ffffffffffffd4c8);
  std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>::~allocator
            ((allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_> *)0x15c278);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_ffffffffffffd4d0);
  std::allocator<unsigned_short>::~allocator((allocator<unsigned_short> *)0x15c292);
  local_84 = 0;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd4c0,
             (value_type_conflict4 *)in_stack_ffffffffffffd4b8);
  local_88 = 1;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd4c0,
             (value_type_conflict4 *)in_stack_ffffffffffffd4b8);
  local_8c = 5;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd4c0,
             (value_type_conflict4 *)in_stack_ffffffffffffd4b8);
  local_90 = 2;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd4c0,
             (value_type_conflict4 *)in_stack_ffffffffffffd4b8);
  local_94 = 3;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd4c0,
             (value_type_conflict4 *)in_stack_ffffffffffffd4b8);
  local_98 = 9;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd4c0,
             (value_type_conflict4 *)in_stack_ffffffffffffd4b8);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffd510,in_stack_ffffffffffffd508);
  LinuxEvents<0>::LinuxEvents(in_stack_ffffffffffffd560,in_stack_ffffffffffffd558);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd4d0);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)0x15c3ae);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
            *)0x15c3bb);
  std::vector<int,_std::allocator<int>_>::size(&local_38);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::resize
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
             in_stack_ffffffffffffd4e0,in_stack_ffffffffffffd4d8);
  std::random_device::random_device(in_stack_ffffffffffffd500);
  std::random_device::operator()((random_device *)0x15c3f6);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            (in_stack_ffffffffffffd4c0,(result_type_conflict)in_stack_ffffffffffffd4b8);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)in_stack_ffffffffffffd4c0,
             (int)((ulong)in_stack_ffffffffffffd4b8 >> 0x20),(int)in_stack_ffffffffffffd4b8);
  local_28b9 = 1;
  local_28c0 = 0;
  while( true ) {
    auVar20 = in_ZMM3._0_16_;
    auVar19 = in_ZMM2._0_16_;
    auVar18 = in_ZMM1._0_16_;
    auVar21 = in_ZMM0._0_16_;
    if (local_10 <= local_28c0) break;
    local_28c8 = 0;
    while( true ) {
      uVar4 = local_28c8;
      sVar7 = std::
              vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
              ::size(&local_50);
      if (sVar7 <= uVar4) break;
      local_28d0 = 0;
      while( true ) {
        uVar4 = local_28d0;
        pvVar8 = std::
                 vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                 ::operator[](&local_50,local_28c8);
        sVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(pvVar8);
        if (sVar7 <= uVar4) break;
        rVar6 = std::uniform_int_distribution<int>::operator()
                          ((uniform_int_distribution<int> *)in_stack_ffffffffffffd4c0,
                           in_stack_ffffffffffffd4b8);
        pvVar8 = std::
                 vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                 ::operator[](&local_50,local_28c8);
        pvVar9 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           (pvVar8,local_28d0);
        *pvVar9 = (value_type)rVar6;
        local_28d0 = local_28d0 + 1;
      }
      local_28c8 = local_28c8 + 1;
    }
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x15c65c);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffd4e0,
               in_stack_ffffffffffffd4d8,(allocator_type *)in_stack_ffffffffffffd4d0);
    std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
              ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x15c68d);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::vector(in_stack_ffffffffffffd4e0,in_stack_ffffffffffffd4d8,
             (value_type *)in_stack_ffffffffffffd4d0,(allocator_type *)in_stack_ffffffffffffd4c8);
    std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
              ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x15c6c1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffd4d0);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x15c6db);
    for (local_2910 = 0; local_2910 < local_c; local_2910 = local_2910 + 1) {
      std::
      vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ::operator[](&local_50,local_2910);
      puVar10 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x15c724);
      pvVar8 = std::
               vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
               ::operator[](&local_50,local_2910);
      sVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(pvVar8);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::operator[](&local_28e8,local_2910);
      puVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x15c76d);
      pospopcnt_u16_scalar_naive(puVar10,(uint32_t)sVar7,puVar11);
    }
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x15c834);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffd4e0,
               in_stack_ffffffffffffd4d8,(allocator_type *)in_stack_ffffffffffffd4d0);
    std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
              ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x15c865);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::vector(in_stack_ffffffffffffd4e0,in_stack_ffffffffffffd4d8,
             (value_type *)in_stack_ffffffffffffd4d0,(allocator_type *)in_stack_ffffffffffffd4c8);
    std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
              ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x15c899);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffd4d0);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x15c8b3);
    LinuxEvents<0>::start(in_stack_ffffffffffffd530);
    for (local_2950 = 0; pcVar5 = local_18, local_2950 < local_c; local_2950 = local_2950 + 1) {
      this_00 = &local_50;
      std::
      vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ::operator[](this_00,local_2950);
      puVar10 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x15c91b);
      pvVar8 = std::
               vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
               ::operator[](this_00,local_2950);
      sVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(pvVar8);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::operator[](&local_2928,local_2950);
      puVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x15c964);
      auVar21 = (*pcVar5)(puVar10,sVar7 & 0xffffffff,puVar11);
      in_ZMM1._0_8_ = auVar21._8_8_;
      in_ZMM0._0_8_ = auVar21._0_8_;
      in_ZMM1._8_56_ = extraout_var_00;
      in_ZMM0._8_56_ = extraout_var;
    }
    LinuxEvents<0>::end((LinuxEvents<0> *)
                        CONCAT44(in_stack_ffffffffffffd554,in_stack_ffffffffffffd550),
                        in_stack_ffffffffffffd548);
    local_2958 = 0;
    for (local_2960 = 0; local_2960 < local_c; local_2960 = local_2960 + 1) {
      for (local_2968 = 0; local_2968 < 0x10; local_2968 = local_2968 + 1) {
        pvVar12 = std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::operator[](&local_2928,local_2960);
        pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (pvVar12,local_2968);
        local_2958 = (ulong)*pvVar13 + local_2958;
      }
    }
    if (local_2958 == 0) {
      local_1 = 0;
      local_296c = 1;
    }
    else {
      for (local_2978 = 0; local_2978 < local_c; local_2978 = local_2978 + 1) {
        for (local_2980 = 0; local_2980 < 0x10; local_2980 = local_2980 + 1) {
          pvVar12 = std::
                    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ::operator[](&local_28e8,local_2978);
          pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (pvVar12,local_2980);
          in_stack_ffffffffffffd554 = *pvVar13;
          pvVar12 = std::
                    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ::operator[](&local_2928,local_2978);
          pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (pvVar12,local_2980);
          if (in_stack_ffffffffffffd554 != *pvVar13) {
            if ((local_1a & 1) != 0) {
              printf("bug:\n");
              printf("expected : ");
              std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::operator[](&local_28e8,local_2978);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x15cbed);
              print16((uint32_t *)in_stack_ffffffffffffd4c0);
              printf("got      : ");
              std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::operator[](&local_2928,local_2978);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x15cc24);
              print16((uint32_t *)in_stack_ffffffffffffd4c0);
              local_1 = 0;
              local_296c = 1;
              goto LAB_0015cca5;
            }
            local_28b9 = 0;
          }
        }
      }
      std::
      vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
      ::push_back((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                   *)in_stack_ffffffffffffd4d0,(value_type *)in_stack_ffffffffffffd4c8);
      local_296c = 0;
    }
LAB_0015cca5:
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)in_stack_ffffffffffffd4d0);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)in_stack_ffffffffffffd4d0);
    if (local_296c != 0) goto LAB_0015d104;
    local_28c0 = local_28c0 + 1;
  }
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
            *)in_stack_ffffffffffffd510,
           (vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
            *)in_stack_ffffffffffffd508);
  compute_mins((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                *)in_stack_ffffffffffffd508);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
             *)in_stack_ffffffffffffd4d0);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
            *)in_stack_ffffffffffffd510,
           (vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
            *)in_stack_ffffffffffffd508);
  compute_averages(in_stack_ffffffffffffd538);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
             *)in_stack_ffffffffffffd4d0);
  if ((local_19 & 1) == 0) {
    pvVar22 = &local_2998;
    pvVar14 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                        (pvVar22,0);
    auVar20 = vcvtusi2sd_avx512f(auVar21,*pvVar14);
    auVar21 = vcvtusi2sd_avx512f(auVar18,local_8 * local_c);
    in_stack_ffffffffffffd4c0 =
         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)(auVar20._0_8_ / auVar21._0_8_);
    pvVar14 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                        (pvVar22,5);
    auVar18 = vcvtusi2sd_avx512f(auVar21,*pvVar14);
    auVar21 = vcvtusi2sd_avx512f(auVar19,local_8 * local_c);
    printf("cycles per 16-bit word:  %4.3f; ref cycles per 16-bit word: %4.3f \n",
           in_stack_ffffffffffffd4c0,auVar18._0_8_ / auVar21._0_8_);
  }
  else {
    pvVar22 = &local_2998;
    sVar7 = 1;
    pvVar14 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                        (pvVar22,1);
    auVar21 = vcvtusi2sd_avx512f(auVar21,*pvVar14);
    pvVar14 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                        (pvVar22,0);
    auVar18 = vcvtusi2sd_avx512f(auVar18,*pvVar14);
    auVar17._0_8_ = auVar21._0_8_ / auVar18._0_8_;
    auVar17._8_8_ = 0;
    auVar21 = auVar17;
    pvVar14 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                        (pvVar22,0);
    auVar3 = vcvtusi2sd_avx512f(auVar21,*pvVar14);
    auVar21 = vcvtusi2sd_avx512f(auVar18,local_8 * local_c);
    dVar16 = auVar3._0_8_ / auVar21._0_8_;
    pvVar14 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                        (pvVar22,sVar7);
    auVar18 = vcvtusi2sd_avx512f(auVar19,*pvVar14);
    auVar21 = vcvtusi2sd_avx512f(auVar20,local_8 * local_c);
    printf("instructions per cycle %4.2f, cycles per 16-bit word:  %4.3f, instructions per 16-bit word %4.3f \n"
           ,auVar17._0_8_,dVar16,auVar18._0_8_ / auVar21._0_8_);
    pvVar14 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                        (&local_2998,0);
    vVar2 = *pvVar14;
    pvVar14 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                        (&local_2998,1);
    vVar25 = *pvVar14;
    pvVar14 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                        (&local_2998,2);
    vVar26 = *pvVar14;
    pvVar14 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                        (&local_2998,3);
    vVar27 = *pvVar14;
    pvVar14 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                        (&local_2998,4);
    printf("min: %8llu cycles, %8llu instructions, \t%8llu branch mis., %8llu cache ref., %8llu cache mis.\n"
           ,vVar2,vVar25,vVar26,vVar27,*pvVar14);
    this = local_29c8;
    pvVar15 = std::vector<double,_std::allocator<double>_>::operator[](this,0);
    in_stack_ffffffffffffd4d0 = (allocator_type *)*pvVar15;
    pvVar15 = std::vector<double,_std::allocator<double>_>::operator[](this,1);
    vVar23 = *pvVar15;
    pvVar15 = std::vector<double,_std::allocator<double>_>::operator[](this,2);
    vVar24 = *pvVar15;
    pvVar15 = std::vector<double,_std::allocator<double>_>::operator[](this,3);
    vVar1 = *pvVar15;
    pvVar15 = std::vector<double,_std::allocator<double>_>::operator[](this,4);
    printf("avg: %8.1f cycles, %8.1f instructions, \t%8.1f branch mis., %8.1f cache ref., %8.1f cache mis.\n"
           ,in_stack_ffffffffffffd4d0,vVar23,vVar24,vVar1,*pvVar15);
  }
  local_1 = local_28b9 & 1;
  local_296c = 1;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd4d0);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
             in_stack_ffffffffffffd4d0);
LAB_0015d104:
  std::random_device::~random_device((random_device *)0x15d111);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
             *)in_stack_ffffffffffffd4d0);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
             in_stack_ffffffffffffd4d0);
  LinuxEvents<0>::~LinuxEvents((LinuxEvents<0> *)in_stack_ffffffffffffd4c0);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
             *)in_stack_ffffffffffffd4d0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd4d0);
  return (bool)(local_1 & 1);
}

Assistant:

bool benchmarkMany(uint32_t n, uint32_t m, uint32_t iterations, pospopcnt_u16_method_type fn, bool verbose, bool test) {
    std::vector<int> evts;
    std::vector<std::vector<uint16_t>> vdata(m, std::vector<uint16_t>(n));
    evts.push_back(PERF_COUNT_HW_CPU_CYCLES);
    evts.push_back(PERF_COUNT_HW_INSTRUCTIONS);
    evts.push_back(PERF_COUNT_HW_BRANCH_MISSES);
    evts.push_back(PERF_COUNT_HW_CACHE_REFERENCES);
    evts.push_back(PERF_COUNT_HW_CACHE_MISSES);
    evts.push_back(PERF_COUNT_HW_REF_CPU_CYCLES);
    LinuxEvents<PERF_TYPE_HARDWARE> unified(evts);
    std::vector<unsigned long long> results; // tmp buffer
    std::vector< std::vector<unsigned long long> > allresults;
    results.resize(evts.size());
    
    std::random_device rd;
    std::mt19937 gen(rd());
    std::uniform_int_distribution<> dis(0, 0xFFFF);

    bool isok = true;
    for (uint32_t i = 0; i < iterations; i++) {
        for (size_t k = 0; k < vdata.size(); k++) {
            for(size_t k2 = 0; k2 < vdata[k].size() ; k2++) { 
               vdata[k][k2] = dis(gen); // random init.
            }
        }
        std::vector<std::vector<uint32_t>> correctflags(m,std::vector<uint32_t>(16));
        for (size_t k = 0; k < m; k++) {
          pospopcnt_u16_scalar_naive(vdata[k].data(), vdata[k].size(), correctflags[k].data()); // this is our gold standard
        }
        std::vector<std::vector<uint32_t>> flags(m,std::vector<uint32_t>(16));
        
        unified.start();
        for (size_t k = 0; k < m ; k++) {
          fn(vdata[k].data(), vdata[k].size(), flags[k].data());
        }
        unified.end(results);

        uint64_t tot_obs = 0;
        for (size_t km = 0; km < m; ++km)
          for (size_t k = 0; k < 16; ++k) tot_obs += flags[km][k];
        if (tot_obs == 0) { // when a method is not supported it returns all zero
            return false;
        }
        for (size_t km = 0; km < m; ++km) {
          for (size_t k = 0; k < 16; k++) {
            if (correctflags[km][k] != flags[km][k]) {
                if (test) {
                    printf("bug:\n");
                    printf("expected : ");
                    print16(correctflags[km].data());
                    printf("got      : ");
                    print16(flags[km].data());
                    return false;
                } else {
                    isok = false;
                }
            }
          }
        }
        allresults.push_back(results);
    }

    std::vector<unsigned long long> mins = compute_mins(allresults);
    std::vector<double> avg = compute_averages(allresults);
    
    if (verbose) {
        printf("instructions per cycle %4.2f, cycles per 16-bit word:  %4.3f, "
               "instructions per 16-bit word %4.3f \n",
                double(mins[1]) / mins[0], double(mins[0]) / (n*m), double(mins[1]) / (n*m));
        // first we display mins
        printf("min: %8llu cycles, %8llu instructions, \t%8llu branch mis., %8llu "
               "cache ref., %8llu cache mis.\n",
                mins[0], mins[1], mins[2], mins[3], mins[4]);
        printf("avg: %8.1f cycles, %8.1f instructions, \t%8.1f branch mis., %8.1f "
               "cache ref., %8.1f cache mis.\n",
                avg[0], avg[1], avg[2], avg[3], avg[4]);
    } else {
        printf("cycles per 16-bit word:  %4.3f; ref cycles per 16-bit word: %4.3f \n", double(mins[0]) / (n*m), double(mins[5]) / (n*m));
    }

    return isok;
}